

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O0

int __thiscall
QWindowsStyle::styleHint
          (QWindowsStyle *this,StyleHint hint,QStyleOption *opt,QWidget *widget,
          QStyleHintReturn *returnData)

{
  int iVar1;
  int iVar2;
  QPalette *pQVar3;
  QListView *pQVar4;
  QStyleOptionRubberBand *pQVar5;
  QStyleHintReturnMask *pQVar6;
  QRect *in_RCX;
  QStyleOption *in_RDX;
  undefined4 in_ESI;
  QWidget *in_RDI;
  QStyleHintReturn *in_R8;
  long in_FS_OFFSET;
  QStyleHintReturn *in_stack_00000018;
  int size;
  QStyleHintReturnMask *mask;
  QStyleOptionRubberBand *rbOpt;
  int ret;
  QPalette pal;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff98;
  uint xp2;
  QRect local_38;
  QRegion local_28;
  QRegion local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  xp2 = 0;
  switch(in_ESI) {
  case 0:
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if (in_RDX == (QStyleOption *)0x0) {
      if (in_RCX == (QRect *)0x0) {
        QPalette::QPalette((QPalette *)local_18);
      }
      else {
        pQVar3 = QWidget::palette(in_RDI);
        QPalette::QPalette((QPalette *)local_18,(QPalette *)pQVar3);
      }
    }
    else {
      QPalette::QPalette((QPalette *)local_18,(QPalette *)&in_RDX->palette);
    }
    QPalette::window((QPalette *)0x4c8c5d);
    QBrush::color((QBrush *)0x4c8c65);
    iVar1 = QColor::lightness();
    QPalette::text((QPalette *)0x4c8c7e);
    QBrush::color((QBrush *)0x4c8c86);
    iVar2 = QColor::lightness();
    xp2 = (uint)(iVar2 < iVar1);
    QPalette::~QPalette((QPalette *)local_18);
    break;
  default:
    xp2 = QCommonStyle::styleHint
                    ((QCommonStyle *)returnData,ret,&rbOpt->super_QStyleOption,(QWidget *)mask,
                     in_stack_00000018);
    break;
  case 7:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x1b:
    xp2 = 1;
    break;
  case 0x10:
  case 0x6c:
    xp2 = 400;
    break;
  case 0x16:
    xp2 = 1;
    break;
  case 0x25:
    xp2 = 0;
    break;
  case 0x36:
    pQVar5 = qstyleoption_cast<QStyleOptionRubberBand_const*>(in_RDX);
    if ((pQVar5 != (QStyleOptionRubberBand *)0x0) && (xp2 = 0, pQVar5->shape == Rectangle)) {
      xp2 = 1;
      pQVar6 = qstyleoption_cast<QStyleHintReturnMask*>(in_R8);
      if (pQVar6 != (QStyleHintReturnMask *)0x0) {
        QRegion::QRegion(&local_20,(QRect *)&in_RDX->rect,Rectangle);
        QRegion::operator=((QRegion *)in_RDI,
                           (QRegion *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
        ;
        QRegion::~QRegion(&local_20);
        if (in_RCX != (QRect *)0x0) {
          QWidget::isWindow(in_RDI);
        }
        local_38 = QRect::adjusted(in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,xp2,
                                   in_stack_ffffffffffffff98);
        QRegion::QRegion(&local_28,(QRect *)&local_38,Rectangle);
        QRegion::operator-=(&pQVar6->region,(QRegion *)&local_28);
        QRegion::~QRegion(&local_28);
      }
    }
    break;
  case 0x3c:
    pQVar4 = qobject_cast<QListView_const*>((QObject *)0x4c8ccd);
    if (pQVar4 != (QListView *)0x0) {
      xp2 = 1;
    }
    break;
  case 0x47:
    xp2 = 0;
    break;
  case 0x4e:
    xp2 = 1;
    break;
  case 0x4f:
    xp2 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return xp2;
  }
  __stack_chk_fail();
}

Assistant:

int QWindowsStyle::styleHint(StyleHint hint, const QStyleOption *opt, const QWidget *widget,
                             QStyleHintReturn *returnData) const
{
    int ret = 0;

    switch (hint) {
    case SH_EtchDisabledText: {
        const QPalette pal = opt ? opt->palette
                                 : widget ? widget->palette()
                                          : QPalette();
        ret = pal.window().color().lightness() > pal.text().color().lightness()
            ? 1 : 0;
        break;
    }
    case SH_Slider_SnapToValue:
    case SH_PrintDialog_RightAlignButtons:
    case SH_FontDialog_SelectAssociatedText:
    case SH_Menu_AllowActiveAndDisabled:
    case SH_MenuBar_AltKeyNavigation:
    case SH_MenuBar_MouseTracking:
    case SH_Menu_MouseTracking:
    case SH_ComboBox_ListMouseTracking:
    case SH_Slider_StopMouseOverSlider:
    case SH_MainWindow_SpaceBelowMenuBar:
        ret = 1;

        break;
    case SH_ItemView_ShowDecorationSelected:
#if QT_CONFIG(listview)
        if (qobject_cast<const QListView*>(widget))
            ret = 1;
#endif
        break;
    case SH_ItemView_ChangeHighlightOnFocus:
        ret = 1;
        break;
    case SH_ToolBox_SelectedPageTitleBold:
        ret = 0;
        break;

#if defined(Q_OS_WIN)
    case SH_UnderlineShortcut:
    {
        ret = 1;
        BOOL cues = false;
        SystemParametersInfo(SPI_GETKEYBOARDCUES, 0, &cues, 0);
        ret = int(cues);
        // Do nothing if we always paint underlines
        Q_D(const QWindowsStyle);
        if (!ret && widget && d) {
#if QT_CONFIG(menubar)
            const QMenuBar *menuBar = qobject_cast<const QMenuBar *>(widget);
            if (!menuBar && qobject_cast<const QMenu *>(widget)) {
                QWidget *w = QApplication::activeWindow();
                if (w && w != widget)
                    menuBar = w->findChild<QMenuBar *>();
            }
            // If we paint a menu bar draw underlines if is in the keyboardState
            if (menuBar) {
                if (menuBar->d_func()->keyboardState || d->altDown())
                    ret = 1;
                // Otherwise draw underlines if the toplevel widget has seen an alt-press
            } else
#endif // QT_CONFIG(menubar)
            if (d->hasSeenAlt(widget)) {
                ret = 1;
            }
        }
#if QT_CONFIG(accessibility)
        if (!ret && opt && opt->type == QStyleOption::SO_MenuItem
            && QStyleHelper::isInstanceOf(opt->styleObject, QAccessible::MenuItem)
            && opt->styleObject->property("_q_showUnderlined").toBool())
            ret = 1;
#endif // QT_CONFIG(accessibility)
        break;
    }
#endif // Q_OS_WIN
    case SH_Menu_SubMenuSloppyCloseTimeout:
    case SH_Menu_SubMenuPopupDelay: {
#if defined(Q_OS_WIN)
        DWORD delay;
        if (SystemParametersInfo(SPI_GETMENUSHOWDELAY, 0, &delay, 0))
            ret = delay;
        else
#endif // Q_OS_WIN
            ret = 400;
        break;
    }
#if QT_CONFIG(rubberband)
    case SH_RubberBand_Mask:
        if (const QStyleOptionRubberBand *rbOpt = qstyleoption_cast<const QStyleOptionRubberBand *>(opt)) {
            ret = 0;
            if (rbOpt->shape == QRubberBand::Rectangle) {
                ret = true;
                if (QStyleHintReturnMask *mask = qstyleoption_cast<QStyleHintReturnMask*>(returnData)) {
                    mask->region = opt->rect;
                    int size = 1;
                    if (widget && widget->isWindow())
                        size = 4;
                    mask->region -= opt->rect.adjusted(size, size, -size, -size);
                }
            }
        }
        break;
#endif // QT_CONFIG(rubberband)
#if QT_CONFIG(wizard)
    case SH_WizardStyle:
        ret = QWizard::ModernStyle;
        break;
#endif
    case SH_ItemView_ArrowKeysNavigateIntoChildren:
        ret = true;
        break;
    case SH_DialogButtonBox_ButtonsHaveIcons:
        ret = 0;
        break;
    default:
        ret = QCommonStyle::styleHint(hint, opt, widget, returnData);
        break;
    }
    return ret;
}